

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_elf32m68k.c
# Opt level: O1

void m68k_readconv(GlobalVars *gv,LinkFile *lf)

{
  bool bVar1;
  char *pcVar2;
  ar_info ai;
  
  if (lf->type != '\b') {
    lf->objname = lf->filename;
    elf32_parse(gv,lf,(Elf32_Ehdr *)lf->data,m68k_reloc_elf2vlink);
    return;
  }
  bVar1 = ar_init(&ai,(char *)lf->data,lf->length,lf->filename);
  if (bVar1 == 0) {
    ierror("m68k_readconv(): archive %s corrupted since last access",lf->pathname);
  }
  else {
    bVar1 = ar_extract(&ai);
    if (bVar1 != 0) {
      do {
        pcVar2 = allocstring(ai.name);
        lf->objname = pcVar2;
        elf_check_ar_type(fff[lf->format],lf->pathname,ai.data,'\x01','\x02',1,1,4);
        elf32_parse(gv,lf,(Elf32_Ehdr *)ai.data,m68k_reloc_elf2vlink);
        bVar1 = ar_extract(&ai);
      } while (bVar1 != 0);
    }
  }
  return;
}

Assistant:

static void m68k_readconv(struct GlobalVars *gv,struct LinkFile *lf)
/* Read ELF-68k executable / object / shared obj. */
{
  if (lf->type == ID_LIBARCH) {
    struct ar_info ai;

    if (ar_init(&ai,(char *)lf->data,lf->length,lf->filename)) {
      while (ar_extract(&ai)) {
        lf->objname = allocstring(ai.name);
        elf_check_ar_type(fff[lf->format],lf->pathname,ai.data,
                          ELFCLASS32,ELFDATA2MSB,ELF_VER,1,EM_68K);
        elf32_parse(gv,lf,(struct Elf32_Ehdr *)ai.data,m68k_reloc_elf2vlink);
      }
    }
    else
      ierror("m68k_readconv(): archive %s corrupted since last access",
             lf->pathname);
  }
  else {
    lf->objname = lf->filename;
    elf32_parse(gv,lf,(struct Elf32_Ehdr *)lf->data,m68k_reloc_elf2vlink);
  }
}